

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<double,double>
          (BaseAppender *this,Vector *col,double input)

{
  double dVar1;
  
  dVar1 = Cast::Operation<double,double>(input);
  *(double *)(col->data + (this->chunk).count * 8) = dVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}